

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVar.cpp
# Opt level: O0

void __thiscall jbcoin::detail::STVar::STVar(STVar *this,SerialIter *sit,SField *name)

{
  SField *name_local;
  SerialIter *sit_local;
  STVar *this_local;
  
  this->p_ = (STBase *)0x0;
  switch(name->fieldType) {
  case STI_NOTPRESENT:
    construct<jbcoin::STBase,jbcoin::SField_const&>(this,name);
    break;
  case STI_UINT16:
    construct<jbcoin::STInteger<unsigned_short>,jbcoin::SerialIter&,jbcoin::SField_const&>
              (this,sit,name);
    break;
  case STI_UINT32:
    construct<jbcoin::STInteger<unsigned_int>,jbcoin::SerialIter&,jbcoin::SField_const&>
              (this,sit,name);
    break;
  case STI_UINT64:
    construct<jbcoin::STInteger<unsigned_long>,jbcoin::SerialIter&,jbcoin::SField_const&>
              (this,sit,name);
    break;
  case STI_HASH128:
    construct<jbcoin::STBitString<128ul>,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
    break;
  case STI_HASH256:
    construct<jbcoin::STBitString<256ul>,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
    break;
  case STI_AMOUNT:
    construct<jbcoin::STAmount,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
    break;
  case STI_VL:
    construct<jbcoin::STBlob,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
    break;
  case STI_ACCOUNT:
    construct<jbcoin::STAccount,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
    break;
  default:
    Throw<std::runtime_error,char_const(&)[20]>((char (*) [20])"Unknown object type");
  case STI_OBJECT:
    construct<jbcoin::STObject,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
    break;
  case STI_ARRAY:
    construct<jbcoin::STArray,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
    break;
  case STI_UINT8:
    construct<jbcoin::STInteger<unsigned_char>,jbcoin::SerialIter&,jbcoin::SField_const&>
              (this,sit,name);
    break;
  case STI_HASH160:
    construct<jbcoin::STBitString<160ul>,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
    break;
  case STI_PATHSET:
    construct<jbcoin::STPathSet,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
    break;
  case STI_VECTOR256:
    construct<jbcoin::STVector256,jbcoin::SerialIter&,jbcoin::SField_const&>(this,sit,name);
  }
  return;
}

Assistant:

STVar::STVar (SerialIter& sit, SField const& name)
{
    switch (name.fieldType)
    {
    case STI_NOTPRESENT:    construct<STBase>(name); return;
    case STI_UINT8:         construct<STUInt8>(sit, name); return;
    case STI_UINT16:        construct<STUInt16>(sit, name); return;
    case STI_UINT32:        construct<STUInt32>(sit, name); return;
    case STI_UINT64:        construct<STUInt64>(sit, name); return;
    case STI_AMOUNT:        construct<STAmount>(sit, name); return;
    case STI_HASH128:       construct<STHash128>(sit, name); return;
    case STI_HASH160:       construct<STHash160>(sit, name); return;
    case STI_HASH256:       construct<STHash256>(sit, name); return;
    case STI_VECTOR256:     construct<STVector256>(sit, name); return;
    case STI_VL:            construct<STBlob>(sit, name); return;
    case STI_ACCOUNT:       construct<STAccount>(sit, name); return;
    case STI_PATHSET:       construct<STPathSet>(sit, name); return;
    case STI_OBJECT:        construct<STObject>(sit, name); return;
    case STI_ARRAY:         construct<STArray>(sit, name); return;
    default:
        Throw<std::runtime_error> ("Unknown object type");
    }
}